

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase378::run(TestCase378 *this)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception_00;
  long *plVar1;
  _func_int ***ppp_Var2;
  _func_int ***ppp_Var3;
  undefined8 uVar4;
  PromiseNode *pPVar5;
  TransformPromiseNodeBase *pTVar6;
  long lVar7;
  Exception *exception;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar8;
  Own<kj::_::ChainPromiseNode> OVar9;
  int counter;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_280;
  int local_26c;
  Own<kj::_::PromiseNode> local_268;
  Own<kj::_::PromiseNode> local_258;
  WaitScope local_248;
  Own<kj::_::PromiseNode> local_238;
  undefined8 *local_228;
  PromiseNode *pPStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  long local_1e8 [2];
  ExceptionOrValue local_1d8;
  char local_78;
  EventLoop local_68;
  
  EventLoop::EventLoop(&local_68);
  local_248.busyPollInterval = 0xffffffff;
  local_248.loop = &local_68;
  EventLoop::enterScope(&local_68);
  local_26c = 0;
  local_1e8[0] = 0;
  local_1e8[1] = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = (undefined8 *)0x0;
  pPStack_220 = (PromiseNode *)0x0;
  local_238.disposer = (Disposer *)0x0;
  local_238.ptr = (PromiseNode *)0x0;
  _::yield();
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,(Own<kj::_::PromiseNode> *)&local_1d8,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:385:27),_kj::_::PropagateException>
             ::anon_class_16_2_209cabb3_for_func::operator());
  uVar4 = local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00434fb8;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_26c;
  pTVar6[1].dependency.disposer = (Disposer *)&local_238;
  local_280.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase378::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_280.ptr = (PromiseNode *)pTVar6;
  if ((PromiseNode *)local_1d8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_1d8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_1d8.exception.ptr._4_4_,local_1d8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_1d8.exception.ptr._4_4_,local_1d8.exception.ptr._0_4_),
      (char *)(uVar4 + (long)(*(_func_int ***)uVar4)[-2]));
  }
  OVar8 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_1d8,&local_280);
  pPVar5 = (PromiseNode *)local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
  if (pPStack_220 != (PromiseNode *)0x0) {
    lVar7 = (long)pPStack_220 + *(long *)(*(long *)pPStack_220 + -0x10);
    pPStack_220 = (PromiseNode *)local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
    (**(code **)*local_228)(local_228,lVar7,OVar8.ptr);
    pPVar5 = pPStack_220;
  }
  pPStack_220 = pPVar5;
  pPVar5 = local_280.ptr;
  if ((TransformPromiseNodeBase *)local_280.ptr != (TransformPromiseNodeBase *)0x0) {
    local_280.ptr = (PromiseNode *)0x0;
    (**(local_280.disposer)->_vptr_Disposer)
              (local_280.disposer,
               ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  _::yield();
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,&local_258,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:420:27),_kj::_::PropagateException>
             ::anon_class_8_1_bc7188dc_for_func::operator());
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004352e8;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_26c;
  local_280.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::TestCase378::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_280.ptr = (PromiseNode *)pTVar6;
  OVar9 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_1d8,&local_280);
  pPVar5 = local_280.ptr;
  local_268.disposer._0_4_ = local_1d8.exception.ptr._0_4_;
  local_268.disposer._4_4_ = local_1d8.exception.ptr._4_4_;
  local_268.ptr = (PromiseNode *)local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((TransformPromiseNodeBase *)local_280.ptr != (TransformPromiseNodeBase *)0x0) {
    local_280.ptr = (PromiseNode *)0x0;
    (**(local_280.disposer)->_vptr_Disposer)
              (local_280.disposer,
               ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode,OVar9.ptr);
  }
  pPVar5 = local_258.ptr;
  if (local_258.ptr != (PromiseNode *)0x0) {
    local_258.ptr = (PromiseNode *)0x0;
    (**(local_258.disposer)->_vptr_Disposer)
              (local_258.disposer,pPVar5->_vptr_PromiseNode[-2] + (long)&pPVar5->_vptr_PromiseNode);
  }
  OVar8 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_1d8,&local_268);
  pPVar5 = (PromiseNode *)local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_238.ptr != (PromiseNode *)0x0) {
    ppp_Var2 = &(local_238.ptr)->_vptr_PromiseNode;
    ppp_Var3 = &(local_238.ptr)->_vptr_PromiseNode;
    local_238.ptr = (PromiseNode *)local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
    (**(local_238.disposer)->_vptr_Disposer)
              (local_238.disposer,(*ppp_Var2)[-2] + (long)ppp_Var3,OVar8.ptr);
    pPVar5 = local_238.ptr;
  }
  local_238.ptr = pPVar5;
  pPVar5 = local_268.ptr;
  if (local_268.ptr != (PromiseNode *)0x0) {
    local_268.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_268.disposer._4_4_,(uint)local_268.disposer))
              ((undefined8 *)CONCAT44(local_268.disposer._4_4_,(uint)local_268.disposer),
               pPVar5->_vptr_PromiseNode[-2] + (long)&pPVar5->_vptr_PromiseNode);
  }
  exception_00 = &local_1d8.exception.ptr.field_1;
  lVar7 = 0;
  do {
    local_1d8.exception.ptr._0_4_ = local_1d8.exception.ptr._0_4_ & 0xffffff00;
    local_78 = '\0';
    _::waitImpl((Own<kj::_::PromiseNode> *)((long)&local_238.disposer + lVar7),&local_1d8,&local_248
               );
    if (local_78 == '\x01') {
      if ((kj)local_1d8.exception.ptr.isSet != (kj)0x0) {
        throwRecoverableException(&exception_00->value,0);
      }
    }
    else {
      if ((kj)local_1d8.exception.ptr.isSet == (kj)0x0) {
        _::unreachable();
      }
      throwRecoverableException(&exception_00->value,0);
    }
    if ((kj)local_1d8.exception.ptr.isSet == (kj)0x1) {
      Exception::~Exception(&exception_00->value);
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x60);
  if ((local_26c != 7) && (_::Debug::minSeverity < 3)) {
    local_1d8.exception.ptr._0_4_ = 7;
    _::Debug::log<char_const(&)[34],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1b0,ERROR,"\"failed: expected \" \"(7) == (counter)\", 7, counter",
               (char (*) [34])"failed: expected (7) == (counter)",(int *)&local_1d8,&local_26c);
  }
  lVar7 = 0;
  do {
    plVar1 = *(long **)((long)local_1e8 + lVar7 + 8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)local_1e8 + lVar7 + 8) = 0;
      (**(code **)**(undefined8 **)((long)local_1e8 + lVar7))
                (*(undefined8 **)((long)local_1e8 + lVar7),(long)plVar1 + *(long *)(*plVar1 + -0x10)
                );
    }
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -0x60);
  EventLoop::leaveScope(local_248.loop);
  EventLoop::~EventLoop(&local_68);
  return;
}

Assistant:

TEST(Async, Ordering) {
  EventLoop loop;
  WaitScope waitScope(loop);

  int counter = 0;
  Promise<void> promises[6] = {nullptr, nullptr, nullptr, nullptr, nullptr, nullptr};

  promises[1] = evalLater([&]() {
    EXPECT_EQ(0, counter++);

    {
      // Use a promise and fulfiller so that we can fulfill the promise after waiting on it in
      // order to induce depth-first scheduling.
      auto paf = kj::newPromiseAndFulfiller<void>();
      promises[2] = paf.promise.then([&]() {
        EXPECT_EQ(1, counter++);
      }).eagerlyEvaluate(nullptr);
      paf.fulfiller->fulfill();
    }

    // .then() is scheduled breadth-first if the promise has already resolved, but depth-first
    // if the promise resolves later.
    promises[3] = Promise<void>(READY_NOW).then([&]() {
      EXPECT_EQ(4, counter++);
    }).then([&]() {
      EXPECT_EQ(5, counter++);
    }).eagerlyEvaluate(nullptr);

    {
      auto paf = kj::newPromiseAndFulfiller<void>();
      promises[4] = paf.promise.then([&]() {
        EXPECT_EQ(2, counter++);
      }).eagerlyEvaluate(nullptr);
      paf.fulfiller->fulfill();
    }

    // evalLater() is like READY_NOW.then().
    promises[5] = evalLater([&]() {
      EXPECT_EQ(6, counter++);
    }).eagerlyEvaluate(nullptr);
  }).eagerlyEvaluate(nullptr);

  promises[0] = evalLater([&]() {
    EXPECT_EQ(3, counter++);

    // Making this a chain should NOT cause it to preempt promises[1].  (This was a problem at one
    // point.)
    return Promise<void>(READY_NOW);
  }).eagerlyEvaluate(nullptr);

  for (auto i: indices(promises)) {
    kj::mv(promises[i]).wait(waitScope);
  }

  EXPECT_EQ(7, counter);
}